

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O1

void GraphBase::format_graph(string *filename,string *mode)

{
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *pvVar1;
  pointer pcVar2;
  iterator iVar3;
  pointer ppVar4;
  long lVar5;
  pair<unsigned_int,_float> pVar6;
  pair<unsigned_int,_float> pVar7;
  string *psVar8;
  char cVar9;
  int iVar10;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs;
  ostream *poVar11;
  istream *piVar12;
  long *plVar13;
  pointer pvVar14;
  uint uVar15;
  pointer ppVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  float weight;
  size_t numV;
  uint32_t dstId;
  uint32_t srcId;
  Graph vecG;
  Graph vecGRev;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecInDeg;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecOutDeg;
  size_t numE;
  ifstream infile;
  pair<unsigned_int,_float> local_350;
  size_type local_348;
  uint local_340;
  uint local_33c;
  undefined1 local_338 [24];
  long lStack_320;
  undefined1 local_318 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2e0;
  string *local_2c8;
  long local_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  long *local_298;
  long local_290;
  long local_288 [2];
  string local_278;
  string local_258;
  ulong local_238 [65];
  
  iVar10 = tolower((int)*(mode->_M_dataplus)._M_p);
  uVar15 = iVar10 << 0x18;
  if ((uVar15 | 0x10000000) != 0x77000000) {
    local_298 = local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"The input mode is not supported:","");
    pcVar2 = (mode->_M_dataplus)._M_p;
    local_2b8 = local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,pcVar2,pcVar2 + mode->_M_string_length);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_298,local_290);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_2b8,local_2b0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if (local_2b8 != local_2a8) {
      operator_delete(local_2b8,local_2a8[0] + 1);
    }
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The supported modes: -mode=g or -mode=w",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"g: graph only (default, using WC), w: with edge property",0x38
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  cVar9 = std::__basic_file<char>::is_open();
  if (cVar9 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                   "The file \"",filename);
    plVar13 = (long *)std::__cxx11::string::append(local_318);
    pvVar14 = (pointer)(plVar13 + 2);
    if ((pointer)*plVar13 == pvVar14) {
      local_338._16_8_ =
           (pvVar14->
           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      lStack_320 = plVar13[3];
      local_338._0_8_ = (pointer)(local_338 + 0x10);
    }
    else {
      local_338._16_8_ =
           (pvVar14->
           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_338._0_8_ = (pointer)*plVar13;
    }
    local_338._8_8_ = plVar13[1];
    *plVar13 = (long)pvVar14;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_338._0_8_,local_338._8_8_);
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)((long)(uint *)local_338._16_8_ + 1));
    }
    if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
      operator_delete((void *)local_318._0_8_,(ulong)(local_318._16_8_ + 1));
    }
  }
  else {
    piVar12 = std::istream::_M_extract<unsigned_long>(local_238);
    std::istream::_M_extract<unsigned_long>((ulong *)piVar12);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              *)local_338,local_348,(allocator_type *)local_318);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              *)local_318,local_348,(allocator_type *)&local_2e0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_2e0,local_348,(allocator_type *)&local_2f8);
    local_2c8 = filename;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_2f8,local_348,(allocator_type *)&local_350);
    if (local_2c0 != 0) {
      lVar21 = local_2c0;
      do {
        if (uVar15 == 0x77000000) {
          piVar12 = std::istream::_M_extract<unsigned_int>((uint *)local_238);
          piVar12 = std::istream::_M_extract<unsigned_int>((uint *)piVar12);
          std::istream::_M_extract<float>((float *)piVar12);
        }
        else {
          piVar12 = std::istream::_M_extract<unsigned_int>((uint *)local_238);
          std::istream::_M_extract<unsigned_int>((uint *)piVar12);
        }
        pvVar1 = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  *)(local_338._0_8_ + (ulong)local_33c * 0x18);
        local_350.first = local_340;
        local_350.second = 0.0;
        iVar3._M_current = *(pair<unsigned_int,_float> **)(pvVar1 + 8);
        if (iVar3._M_current == *(pair<unsigned_int,_float> **)(pvVar1 + 0x10)) {
          std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
          _M_realloc_insert<std::pair<unsigned_int,float>>(pvVar1,iVar3,&local_350);
        }
        else {
          pVar6.second = 0.0;
          pVar6.first = local_340;
          *iVar3._M_current = pVar6;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        pvVar1 = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  *)(local_318._0_8_ + (ulong)local_340 * 0x18);
        local_350.first = local_33c;
        local_350.second = 0.0;
        iVar3._M_current = *(pair<unsigned_int,_float> **)(pvVar1 + 8);
        if (iVar3._M_current == *(pair<unsigned_int,_float> **)(pvVar1 + 0x10)) {
          std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
          _M_realloc_insert<std::pair<unsigned_int,float>>(pvVar1,iVar3,&local_350);
        }
        else {
          pVar7.second = 0.0;
          pVar7.first = local_33c;
          *iVar3._M_current = pVar7;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        lVar21 = lVar21 + -1;
      } while (lVar21 != 0);
    }
    std::ifstream::close();
    psVar8 = local_2c8;
    if (local_348 != 0) {
      lVar21 = 1;
      uVar18 = 0;
      do {
        local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar18] =
             (long)(&(((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        *)local_338._0_8_)->_M_impl).super__Vector_impl_data._M_start)[lVar21] -
             *(long *)(local_338._0_8_ + lVar21 * 8 + -8) >> 3;
        local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar18] =
             *(long *)(local_318._0_8_ + lVar21 * 8) - *(long *)(local_318._0_8_ + lVar21 * 8 + -8)
             >> 3;
        uVar18 = uVar18 + 1;
        lVar21 = lVar21 + 3;
      } while (uVar18 < local_348);
    }
    pvVar14 = (pointer)local_338._0_8_;
    if (uVar15 == 0x67000000) {
      for (; pvVar14 != (pointer)local_338._8_8_; pvVar14 = pvVar14 + 1) {
        ppVar4 = (pvVar14->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar16 = (pvVar14->
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar4;
            ppVar16 = ppVar16 + 1) {
          ppVar16->second =
               1.0 / (float)local_2f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[ppVar16->first];
        }
      }
      if (local_318._8_8_ - local_318._0_8_ != 0) {
        lVar21 = ((long)(local_318._8_8_ - local_318._0_8_) >> 3) * -0x5555555555555555;
        lVar17 = 0;
        do {
          lVar5 = *(long *)(local_318._0_8_ + lVar17 * 0x18);
          lVar19 = *(long *)(local_318._0_8_ + lVar17 * 0x18 + 8) - lVar5;
          if (lVar19 != 0) {
            uVar18 = local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar17];
            lVar19 = lVar19 >> 3;
            lVar20 = 0;
            do {
              *(float *)(lVar5 + 4 + lVar20 * 8) = 1.0 / (float)uVar18;
              lVar20 = lVar20 + 1;
            } while (lVar19 + (ulong)(lVar19 == 0) != lVar20);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != lVar21 + (ulong)(lVar21 == 0));
      }
    }
    pcVar2 = (local_2c8->_M_dataplus)._M_p;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar2,pcVar2 + local_2c8->_M_string_length);
    IOcontroller::save_graph_struct(&local_258,(Graph *)local_338,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (psVar8->_M_dataplus)._M_p;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,pcVar2,pcVar2 + psVar8->_M_string_length);
    IOcontroller::save_graph_struct(&local_278,(Graph *)local_318,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The graph is formatted!",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    if (local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2e0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               *)local_318);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               *)local_338);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

static void format_graph(const std::string filename, const std::string mode)
    {
        const char m1 = tolower(mode[0]);
        const bool cond = m1 == 'g' || m1 == 'w';
        if (!cond)
        {
            LogInfo("The input mode is not supported:", mode);
            LogInfo("The supported modes: -mode=g or -mode=w");
            LogInfo("g: graph only (default, using WC), w: with edge property");
        }

        size_t numV, numE;
        uint32_t srcId, dstId;
        float weight = 0.0;
        std::ifstream infile(filename);
        if (!infile.is_open())
        {
            std::cout << "The file \"" + filename + "\" can NOT be opened\n";
            return;
        }
        infile >> numV >> numE;

        // FILE* fin;
        // const errno_t err = fopen_s(&fin, filename.c_str(), "r");
        // if (err != 0)
        // {
        // 	std::cout << "The file \"" + filename + "\" can NOT be opened\n";
        // 	return;
        // }
        // fscanf_s(fin, "%zu%zu", &numV, &numE);

        Graph vecG(numV);
        Graph vecGRev(numV);
        std::vector<size_t> vecOutDeg(numV);
        std::vector<size_t> vecInDeg(numV);
        for (auto i = numE; i--;)
        {
            if (m1 == 'w')
            {
                infile >> srcId >> dstId >> weight;
                // fscanf_s(fin, "%u%u%f", &srcId, &dstId, &weight);
            }
            else
            {
                infile >> srcId >> dstId;
                // fscanf_s(fin, "%u%u", &srcId, &dstId);
            }
            vecG[srcId].push_back(Edge(dstId, weight));
            vecGRev[dstId].push_back(Edge(srcId, weight));
        }
        infile.close();
        for (auto idx = 0; idx < numV; idx++)
        {
            vecOutDeg[idx] = vecG[idx].size();
            vecInDeg[idx] = vecGRev[idx].size();
        }
        if (m1 == 'g')
        {
            // When the input is a graph only, set the diffusion probability using WC setting
            for (auto& nbrs : vecG) {
                for (auto& nbr : nbrs) {
                    nbr.second = (float) 1.0 / vecInDeg[nbr.first];
                }
            }

            for (size_t i = 0; i < vecGRev.size(); i++){
                if (vecGRev[i].size() == 0) {
                    continue;
                }
                weight = (float) 1.0 / vecInDeg[i];
                for (size_t j = 0; j < vecGRev[i].size(); j++) {
                    vecGRev[i][j].second = weight;
                }
            }
            // The bug is found by sibo
            // auto idx = 0;
            // for (auto& inNbrs : vecGRev)
            // {
            //    if (inNbrs.empty()) continue; // Skip if there is no in-neighbor.
            //    weight = (float)1.0 / vecInDeg[idx++];
            //    for (auto& inNbr : inNbrs)
            //    {
            //        inNbr.second = weight;
            //    }
            // }
        }
        TIO::save_graph_struct(filename, vecG, false);
        TIO::save_graph_struct(filename, vecGRev, true);
        std::cout << "The graph is formatted!" << std::endl;
    }